

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asterism_outer_tcp.c
# Opt level: O1

int incoming_parse_cmd_data(asterism_tcp_incoming_s *incoming,uv_buf_t *buf,int *eaten)

{
  uint8_t uVar1;
  asterism_trans_proto_s *proto;
  int iVar2;
  uint uVar3;
  ushort uVar4;
  uv_buf_t __buf;
  uv_buf_t local_40;
  
  if (3 < buf->len) {
    proto = (asterism_trans_proto_s *)buf->base;
    if (proto->version != '\x10') {
      return -1;
    }
    uVar4 = proto->len << 8 | proto->len >> 8;
    if (0x1000 < uVar4) {
      return -1;
    }
    if ((ulong)uVar4 <= buf->len) {
      uVar1 = proto->cmd;
      if (uVar1 == '\x04') {
        iVar2 = parse_cmd_ping(incoming,(asterism_trans_proto_s *)buf);
      }
      else if (uVar1 == '\x03') {
        _asterism_log(ASTERISM_LOG_DEBUG,
                      "/workspace/llm4binary/github/license_c_cmakelists/sosopop[P]asterism/src/asterism/asterism_outer_tcp.c(175)"
                      ,"connection connect ack recv");
        iVar2 = parse_cmd_connect_ack(incoming,proto);
      }
      else {
        if (uVar1 != '\x01') {
          return -1;
        }
        _asterism_log(ASTERISM_LOG_DEBUG,
                      "/workspace/llm4binary/github/license_c_cmakelists/sosopop[P]asterism/src/asterism/asterism_outer_tcp.c(169)"
                      ,"connection join recv");
        iVar2 = parse_cmd_join(incoming,proto);
      }
      if (iVar2 != 0) {
        return -1;
      }
      *eaten = *eaten + (uint)uVar4;
      uVar3 = (int)buf->len - (uint)uVar4;
      local_40.len = (size_t)uVar3;
      if (uVar3 == 0) {
        return 0;
      }
      local_40.base = buf->base + uVar4;
      iVar2 = incoming_parse_cmd_data(incoming,&local_40,eaten);
      return iVar2;
    }
  }
  return 0;
}

Assistant:

static int incoming_parse_cmd_data(
    struct asterism_tcp_incoming_s *incoming,
    uv_buf_t *buf,
    int *eaten)
{
    if (buf->len < sizeof(struct asterism_trans_proto_s))
        return 0;
    struct asterism_trans_proto_s *proto = (struct asterism_trans_proto_s *)buf->base;
    uint16_t proto_len = ntohs(proto->len);
    if (proto->version != ASTERISM_TRANS_PROTO_VERSION)
        return -1;
    if (proto_len > ASTERISM_MAX_PROTO_SIZE)
        return -1;
    if (proto_len > buf->len)
    {
        return 0;
    }
    if (proto->cmd == ASTERISM_TRANS_PROTO_JOIN)
    {
        asterism_log(ASTERISM_LOG_DEBUG, "connection join recv");
        if (parse_cmd_join(incoming, proto) != 0)
            return -1;
    }
    else if (proto->cmd == ASTERISM_TRANS_PROTO_CONNECT_ACK)
    {
        asterism_log(ASTERISM_LOG_DEBUG, "connection connect ack recv");
        if (parse_cmd_connect_ack(incoming, proto) != 0)
            return -1;
    }
    else if (proto->cmd == ASTERISM_TRANS_PROTO_PING)
    {
        //asterism_log(ASTERISM_LOG_DEBUG, "connection ping recv");
        if (parse_cmd_ping(incoming, proto) != 0)
            return -1;
    }
    else
    {
        return -1;
    }
    *eaten += proto_len;
    unsigned int remain = buf->len - proto_len;
    if (remain)
    {
        uv_buf_t __buf;
        __buf.base = buf->base + proto_len;
        __buf.len = remain;
        return incoming_parse_cmd_data(incoming, &__buf, eaten);
    }
    return 0;
}